

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

bool __thiscall
QAbstractItemViewPrivate::dropOn
          (QAbstractItemViewPrivate *this,QDropEvent *event,int *dropRow,int *dropCol,
          QModelIndex *dropIndex)

{
  bool bVar1;
  Int IVar2;
  DropIndicatorPosition DVar3;
  QModelIndex *pQVar4;
  ulong uVar5;
  int *in_RCX;
  int *in_RDX;
  QEvent *in_RSI;
  QAbstractItemViewPrivate *in_RDI;
  undefined8 *in_R8;
  long in_FS_OFFSET;
  int col;
  int row;
  QAbstractItemView *q;
  QModelIndex index;
  undefined4 in_stack_fffffffffffffea8;
  DropAction in_stack_fffffffffffffeac;
  QModelIndex *in_stack_fffffffffffffeb0;
  QPersistentModelIndexData **ppQVar6;
  QDropEvent *in_stack_fffffffffffffeb8;
  QModelIndex *in_stack_fffffffffffffec0;
  int iVar7;
  int iVar8;
  bool local_f1;
  QPersistentModelIndexData *local_f0;
  undefined1 *local_e8;
  QAbstractItemModel *local_e0;
  QPersistentModelIndexData *local_d8;
  undefined1 *local_d0;
  QAbstractItemModel *local_c8;
  undefined1 local_c0 [16];
  QPointF local_b0;
  QPoint local_a0;
  undefined4 local_98;
  QFlagsStorageHelper<Qt::DropAction,_4> local_94;
  QPersistentModelIndex local_90;
  undefined1 *local_88;
  QAbstractItemModel *local_80;
  QPointF local_78;
  QPoint local_68;
  QPersistentModelIndexData *local_60;
  undefined1 *local_58;
  QAbstractItemModel *local_50;
  QPointF local_48;
  QPoint local_38;
  QRect local_30;
  QPersistentModelIndexData *local_20;
  undefined1 *local_18;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (QModelIndex *)q_func(in_RDI);
  bVar1 = QEvent::isAccepted(in_RSI);
  if (bVar1) {
    local_f1 = false;
  }
  else {
    local_20 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::QModelIndex((QModelIndex *)0x80700d);
    local_30 = QWidget::rect((QWidget *)in_RDI);
    local_48 = QDropEvent::position(in_stack_fffffffffffffeb8);
    local_38 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffec0);
    uVar5 = QRect::contains((QPoint *)&local_30,SUB81(&local_38,0));
    if ((uVar5 & 1) != 0) {
      in_stack_fffffffffffffec0 = pQVar4;
      local_78 = QDropEvent::position(in_stack_fffffffffffffeb8);
      local_68 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffec0);
      (**(code **)(*(long *)in_stack_fffffffffffffec0 + 0x1f0))
                (&local_60,in_stack_fffffffffffffec0,&local_68);
      local_20 = local_60;
      local_18 = local_58;
      local_10.ptr = local_50;
      bVar1 = QModelIndex::isValid(in_stack_fffffffffffffeb0);
      if (!bVar1) {
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_90);
        local_20 = local_90.d;
        local_18 = local_88;
        local_10.ptr = local_80;
      }
    }
    local_98 = (**(code **)(*(long *)in_RDI->model + 0xe8))();
    QDropEvent::dropAction((QDropEvent *)in_RSI);
    local_94.super_QFlagsStorage<Qt::DropAction>.i =
         (QFlagsStorage<Qt::DropAction>)
         QFlags<Qt::DropAction>::operator&
                   ((QFlags<Qt::DropAction> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_94);
    if (IVar2 != 0) {
      iVar8 = -1;
      iVar7 = -1;
      bVar1 = ::operator!=(in_stack_fffffffffffffeb0,
                           (QPersistentModelIndex *)
                           CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      if (bVar1) {
        local_b0 = QDropEvent::position(in_stack_fffffffffffffeb8);
        local_a0 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffec0);
        ppQVar6 = &local_20;
        local_c0 = (**(code **)(*(long *)pQVar4 + 0x1e0))();
        DVar3 = (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollAreaPrivate).
                                       super_QFramePrivate.super_QWidgetPrivate + 0x120))
                          (in_RDI,&local_a0,local_c0,ppQVar6);
        in_RDI->dropIndicatorPosition = DVar3;
        switch(in_RDI->dropIndicatorPosition) {
        case OnItem:
        case OnViewport:
          break;
        case AboveItem:
          iVar8 = QModelIndex::row((QModelIndex *)&local_20);
          iVar7 = QModelIndex::column((QModelIndex *)&local_20);
          QModelIndex::parent(in_stack_fffffffffffffec0);
          local_20 = local_d8;
          local_18 = local_d0;
          local_10.ptr = local_c8;
          break;
        case BelowItem:
          iVar8 = QModelIndex::row((QModelIndex *)&local_20);
          iVar8 = iVar8 + 1;
          iVar7 = QModelIndex::column((QModelIndex *)&local_20);
          QModelIndex::parent(in_stack_fffffffffffffec0);
          local_20 = local_f0;
          local_18 = local_e8;
          local_10.ptr = local_e0;
        }
      }
      else {
        in_RDI->dropIndicatorPosition = OnViewport;
      }
      *in_R8 = local_20;
      in_R8[1] = local_18;
      in_R8[2] = local_10.ptr;
      *in_RDX = iVar8;
      *in_RCX = iVar7;
      bVar1 = droppingOnItself((QAbstractItemViewPrivate *)CONCAT44(iVar8,iVar7),
                               (QDropEvent *)in_RDI,in_stack_fffffffffffffec0);
      if (!bVar1) {
        local_f1 = true;
        goto LAB_008073e8;
      }
    }
    local_f1 = false;
  }
LAB_008073e8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_f1;
}

Assistant:

bool QAbstractItemViewPrivate::dropOn(QDropEvent *event, int *dropRow, int *dropCol, QModelIndex *dropIndex)
{
    Q_Q(QAbstractItemView);
    if (event->isAccepted())
        return false;

    QModelIndex index;
    // rootIndex() (i.e. the viewport) might be a valid index
    if (viewport->rect().contains(event->position().toPoint())) {
        index = q->indexAt(event->position().toPoint());
        if (!index.isValid())
            index = root;
    }

    // If we are allowed to do the drop
    if (model->supportedDropActions() & event->dropAction()) {
        int row = -1;
        int col = -1;
        if (index != root) {
            dropIndicatorPosition = position(event->position().toPoint(), q->visualRect(index), index);
            switch (dropIndicatorPosition) {
            case QAbstractItemView::AboveItem:
                row = index.row();
                col = index.column();
                index = index.parent();
                break;
            case QAbstractItemView::BelowItem:
                row = index.row() + 1;
                col = index.column();
                index = index.parent();
                break;
            case QAbstractItemView::OnItem:
            case QAbstractItemView::OnViewport:
                break;
            }
        } else {
            dropIndicatorPosition = QAbstractItemView::OnViewport;
        }
        *dropIndex = index;
        *dropRow = row;
        *dropCol = col;
        if (!droppingOnItself(event, index))
            return true;
    }
    return false;
}